

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

void Omega_h::map_value_into<double>(double a_value,LOs *a2b,Write<signed_char> *b_data)

{
  undefined1 local_70 [8];
  type_conflict2 functor;
  LO na;
  Write<signed_char> *b_data_local;
  LOs *a2b_local;
  double a_value_local;
  ulong local_10;
  
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  functor.a_value._4_4_ = (LO)(local_10 >> 2);
  Write<double>::Write((Write<double> *)local_70,(Write<double> *)b_data);
  Read<int>::Read((Read<int> *)&functor.b_data.shared_alloc_.direct_ptr,a2b);
  functor.a2b.write_.shared_alloc_.direct_ptr = (void *)a_value;
  parallel_for<Omega_h::map_value_into<double>(double,Omega_h::Read<int>,Omega_h::Write<double>)::_lambda(int)_1_>
            ("map_value_into",functor.a_value._4_4_,(type_conflict2 *)local_70);
  map_value_into<double>(double,Omega_h::Read<int>,Omega_h::Write<double>)::{lambda(int)#1}::~Write
            ((_lambda_int__1_ *)local_70);
  return;
}

Assistant:

void map_value_into(T a_value, LOs a2b, Write<T> b_data) {
  auto na = a2b.size();
  auto functor = OMEGA_H_LAMBDA(LO a) { b_data[a2b[a]] = a_value; };
  parallel_for("map_value_into", na, std::move(functor));
}